

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_rescale(secp256k1_gej *r,secp256k1_fe *s)

{
  undefined1 local_40 [8];
  secp256k1_fe zz;
  secp256k1_fe *s_local;
  secp256k1_gej *r_local;
  
  zz.n[4] = (uint64_t)s;
  secp256k1_fe_is_zero(s);
  secp256k1_fe_sqr((secp256k1_fe *)local_40,(secp256k1_fe *)zz.n[4]);
  secp256k1_fe_mul(&r->x,&r->x,(secp256k1_fe *)local_40);
  secp256k1_fe_mul(&r->y,&r->y,(secp256k1_fe *)local_40);
  secp256k1_fe_mul(&r->y,&r->y,(secp256k1_fe *)zz.n[4]);
  secp256k1_fe_mul(&r->z,&r->z,(secp256k1_fe *)zz.n[4]);
  return;
}

Assistant:

static void secp256k1_gej_rescale(secp256k1_gej *r, const secp256k1_fe *s) {
    /* Operations: 4 mul, 1 sqr */
    secp256k1_fe zz;
    VERIFY_CHECK(!secp256k1_fe_is_zero(s));
    secp256k1_fe_sqr(&zz, s);
    secp256k1_fe_mul(&r->x, &r->x, &zz);                /* r->x *= s^2 */
    secp256k1_fe_mul(&r->y, &r->y, &zz);
    secp256k1_fe_mul(&r->y, &r->y, s);                  /* r->y *= s^3 */
    secp256k1_fe_mul(&r->z, &r->z, s);                  /* r->z *= s   */
}